

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

void rndmappos(xchar *x,xchar *y)

{
  int iVar1;
  xchar *y_local;
  xchar *x_local;
  
  if (*x < 'P') {
    if (*x == -1) {
      iVar1 = rn2(0x4f);
      *x = (char)iVar1 + '\x01';
    }
    else if (*x < '\x01') {
      *x = '\x01';
    }
  }
  else {
    *x = 'P';
  }
  if (*y < '\x15') {
    if (*y == -1) {
      iVar1 = rn2(0x15);
      *y = (xchar)iVar1;
    }
    else if (*y < '\0') {
      *y = '\0';
    }
  }
  else {
    *y = '\x15';
  }
  return;
}

Assistant:

static void rndmappos(xchar *x, xchar *y)
{
	if (*x >= COLNO) *x = COLNO;
	else if (*x == -1) *x = rn2(COLNO - 1) + 1;
	else if (*x < 1) *x = 1;

	if (*y >= ROWNO) *y = ROWNO;
	else if (*y == -1) *y = rn2(ROWNO);
	else if (*y < 0) *y = 0;
}